

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

int lyd_list_has_keys(lyd_node *list)

{
  byte bVar1;
  lys_node *plVar2;
  uint uVar3;
  ulong uVar4;
  lyd_node *plVar5;
  
  plVar2 = list->schema;
  if (plVar2->nodetype != LYS_LIST) {
    __assert_fail("list->schema->nodetype == LYS_LIST",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/tree_data.c"
                  ,0x56,"int lyd_list_has_keys(struct lyd_node *)");
  }
  bVar1 = plVar2->padding[2];
  if ((ulong)bVar1 == 0) {
    uVar3 = 1;
  }
  else {
    plVar5 = list->child;
    if (plVar5 == (lyd_node *)0x0) {
      uVar4 = 0;
    }
    else {
      uVar4 = 0;
      do {
        if (plVar5->schema != *(lys_node **)(*(long *)&plVar2[1].flags + uVar4 * 8)) {
          return 0;
        }
        uVar4 = uVar4 + 1;
        plVar5 = plVar5->next;
      } while ((plVar5 != (lyd_node *)0x0) && (uVar4 < bVar1));
    }
    uVar3 = (uint)((uint)bVar1 <= (uint)uVar4);
  }
  return uVar3;
}

Assistant:

int
lyd_list_has_keys(struct lyd_node *list)
{
    struct lyd_node *iter;
    struct lys_node_list *slist;
    int i;

    assert(list->schema->nodetype == LYS_LIST);

    /* even though hash is 0, it may be a valid hash, that is what we are going to check */

    slist = (struct lys_node_list *)list->schema;
    if (!slist->keys_size) {
        /* always has keys */
        return 1;
    }

    i = 0;
    iter = list->child;
    while (iter && (i < slist->keys_size)) {
        if (iter->schema != (struct lys_node *)slist->keys[i]) {
            /* missing key */
            return 0;
        }

        ++i;
        iter = iter->next;
    }
    if (i < slist->keys_size) {
        /* missing key */
        return 0;
    }

    /* all keys found */
    return 1;
}